

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Mish_x86_avx512::forward_inplace(Mish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int *piVar13;
  ulong uVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  undefined1 (*pauVar18) [32];
  uint uVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar94 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  v4sf one;
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  Mat local_78;
  undefined1 auVar66 [32];
  undefined1 auVar73 [32];
  
  iVar21 = bottom_top_blob->elempack;
  if (iVar21 == 0x10) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    convert_packing(bottom_top_blob,&local_78,8,opt);
    (**this->_vptr_Mish_x86_avx512)(this,&local_78,opt);
    convert_packing(&local_78,bottom_top_blob,0x10,opt);
    piVar13 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    uVar1 = bottom_top_blob->c;
    uVar19 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    if (iVar21 == 8) {
      uVar14 = 0;
      uVar20 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar20 = uVar14;
      }
      uVar23 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar23 = uVar14;
      }
      auVar67._8_4_ = 0x42b0c0a5;
      auVar67._0_8_ = 0x42b0c0a542b0c0a5;
      auVar67._12_4_ = 0x42b0c0a5;
      auVar67._16_4_ = 0x42b0c0a5;
      auVar67._20_4_ = 0x42b0c0a5;
      auVar67._24_4_ = 0x42b0c0a5;
      auVar67._28_4_ = 0x42b0c0a5;
      auVar69._8_4_ = 0xc2b0c0a5;
      auVar69._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar69._12_4_ = 0xc2b0c0a5;
      auVar69._16_4_ = 0xc2b0c0a5;
      auVar69._20_4_ = 0xc2b0c0a5;
      auVar69._24_4_ = 0xc2b0c0a5;
      auVar69._28_4_ = 0xc2b0c0a5;
      auVar70._8_4_ = 0x3f000000;
      auVar70._0_8_ = 0x3f0000003f000000;
      auVar70._12_4_ = 0x3f000000;
      auVar70._16_4_ = 0x3f000000;
      auVar70._20_4_ = 0x3f000000;
      auVar70._24_4_ = 0x3f000000;
      auVar70._28_4_ = 0x3f000000;
      auVar92._8_4_ = 0x3fb8aa3b;
      auVar92._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar92._12_4_ = 0x3fb8aa3b;
      auVar92._16_4_ = 0x3fb8aa3b;
      auVar92._20_4_ = 0x3fb8aa3b;
      auVar92._24_4_ = 0x3fb8aa3b;
      auVar92._28_4_ = 0x3fb8aa3b;
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = 0x3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar106._16_4_ = 0x3f800000;
      auVar106._20_4_ = 0x3f800000;
      auVar106._24_4_ = 0x3f800000;
      auVar106._28_4_ = 0x3f800000;
      auVar110._8_4_ = 0x3f318000;
      auVar110._0_8_ = 0x3f3180003f318000;
      auVar110._12_4_ = 0x3f318000;
      auVar110._16_4_ = 0x3f318000;
      auVar110._20_4_ = 0x3f318000;
      auVar110._24_4_ = 0x3f318000;
      auVar110._28_4_ = 0x3f318000;
      auVar114._8_4_ = 0xb95e8083;
      auVar114._0_8_ = 0xb95e8083b95e8083;
      auVar114._12_4_ = 0xb95e8083;
      auVar114._16_4_ = 0xb95e8083;
      auVar114._20_4_ = 0xb95e8083;
      auVar114._24_4_ = 0xb95e8083;
      auVar114._28_4_ = 0xb95e8083;
      auVar118._8_4_ = 0x3ab743ce;
      auVar118._0_8_ = 0x3ab743ce3ab743ce;
      auVar118._12_4_ = 0x3ab743ce;
      auVar118._16_4_ = 0x3ab743ce;
      auVar118._20_4_ = 0x3ab743ce;
      auVar118._24_4_ = 0x3ab743ce;
      auVar118._28_4_ = 0x3ab743ce;
      auVar153._8_4_ = 0x39506967;
      auVar153._0_8_ = 0x3950696739506967;
      auVar153._12_4_ = 0x39506967;
      auVar153._16_4_ = 0x39506967;
      auVar153._20_4_ = 0x39506967;
      auVar153._24_4_ = 0x39506967;
      auVar153._28_4_ = 0x39506967;
      auVar130._8_4_ = 0x3c088908;
      auVar130._0_8_ = 0x3c0889083c088908;
      auVar130._12_4_ = 0x3c088908;
      auVar130._16_4_ = 0x3c088908;
      auVar130._20_4_ = 0x3c088908;
      auVar130._24_4_ = 0x3c088908;
      auVar130._28_4_ = 0x3c088908;
      auVar134._8_4_ = 0x3d2aa9c1;
      auVar134._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar134._12_4_ = 0x3d2aa9c1;
      auVar134._16_4_ = 0x3d2aa9c1;
      auVar134._20_4_ = 0x3d2aa9c1;
      auVar134._24_4_ = 0x3d2aa9c1;
      auVar134._28_4_ = 0x3d2aa9c1;
      auVar138._8_4_ = 0x3e2aaaaa;
      auVar138._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar138._12_4_ = 0x3e2aaaaa;
      auVar138._16_4_ = 0x3e2aaaaa;
      auVar138._20_4_ = 0x3e2aaaaa;
      auVar138._24_4_ = 0x3e2aaaaa;
      auVar138._28_4_ = 0x3e2aaaaa;
      auVar142._8_4_ = 0x3f800000;
      auVar142._0_8_ = 0x3f8000003f800000;
      auVar142._12_4_ = 0x3f800000;
      auVar142._16_4_ = 0x3f800000;
      auVar142._20_4_ = 0x3f800000;
      auVar142._24_4_ = 0x3f800000;
      auVar142._28_4_ = 0x3f800000;
      auVar49 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar71 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
        pauVar18 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar17 = uVar20;
        while (iVar21 = (int)uVar17, uVar17 = (ulong)(iVar21 - 1), iVar21 != 0) {
          auVar58 = vminps_avx512vl(*pauVar18,auVar67);
          auVar59 = vmaxps_avx512vl(auVar58,auVar69);
          auVar60 = vfmadd213ps_avx512vl(auVar92,auVar59,auVar70);
          auVar58 = vroundps_avx(auVar60,1);
          uVar6 = vcmpps_avx512vl(auVar60,auVar58,1);
          auVar60 = vsubps_avx512vl(auVar58,auVar106);
          bVar5 = (bool)((byte)uVar6 & 1);
          auVar125._0_4_ = (float)((uint)bVar5 * auVar60._0_4_ | (uint)!bVar5 * auVar58._0_4_);
          bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar5 * auVar60._4_4_ | (uint)!bVar5 * auVar58._4_4_);
          bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar5 * auVar60._8_4_ | (uint)!bVar5 * auVar58._8_4_);
          bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar5 * auVar60._12_4_ | (uint)!bVar5 * auVar58._12_4_);
          bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
          auVar125._16_4_ = (float)((uint)bVar5 * auVar60._16_4_ | (uint)!bVar5 * auVar58._16_4_);
          bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
          auVar125._20_4_ = (float)((uint)bVar5 * auVar60._20_4_ | (uint)!bVar5 * auVar58._20_4_);
          bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
          auVar125._24_4_ = (float)((uint)bVar5 * auVar60._24_4_ | (uint)!bVar5 * auVar58._24_4_);
          bVar5 = SUB81(uVar6 >> 7,0);
          auVar125._28_4_ = (float)((uint)bVar5 * auVar60._28_4_ | (uint)!bVar5 * auVar58._28_4_);
          auVar58 = vfmsub231ps_avx512vl(auVar59,auVar125,auVar110);
          auVar58 = vfnmsub231ps_avx512vl(auVar58,auVar125,auVar114);
          auVar59 = vmulps_avx512vl(auVar58,auVar58);
          auVar60 = vfmadd213ps_avx512vl(auVar153,auVar58,auVar118);
          auVar60 = vfmadd213ps_avx512vl(auVar60,auVar58,auVar130);
          auVar60 = vfmadd213ps_avx512vl(auVar60,auVar58,auVar134);
          auVar60 = vfmadd213ps_avx512vl(auVar60,auVar58,auVar138);
          auVar60 = vfmadd213ps_avx512vl(auVar60,auVar58,auVar70);
          auVar58 = vfmadd213ps_avx512vl(auVar60,auVar59,auVar58);
          auVar99._0_4_ = auVar58._0_4_ + 1.0;
          auVar99._4_4_ = auVar58._4_4_ + 1.0;
          auVar99._8_4_ = auVar58._8_4_ + 1.0;
          auVar99._12_4_ = auVar58._12_4_ + 1.0;
          auVar99._16_4_ = auVar58._16_4_ + 1.0;
          auVar99._20_4_ = auVar58._20_4_ + 1.0;
          auVar99._24_4_ = auVar58._24_4_ + 1.0;
          auVar99._28_4_ = auVar58._28_4_ + 1.0;
          auVar124._0_4_ = (int)auVar125._0_4_;
          auVar124._4_4_ = (int)auVar125._4_4_;
          auVar124._8_4_ = (int)auVar125._8_4_;
          auVar124._12_4_ = (int)auVar125._12_4_;
          auVar124._16_4_ = (int)auVar125._16_4_;
          auVar124._20_4_ = (int)auVar125._20_4_;
          auVar124._24_4_ = (int)auVar125._24_4_;
          auVar124._28_4_ = (int)auVar125._28_4_;
          auVar58 = vpslld_avx2(auVar124,0x17);
          auVar58 = vpaddd_avx2(auVar58,auVar142);
          auVar24 = vfmadd213ps_fma(auVar58,auVar99,auVar106);
          uVar6 = vcmpps_avx512vl(ZEXT1632(auVar24),_DAT_004f1800,2);
          auVar58._8_4_ = 0x800000;
          auVar58._0_8_ = 0x80000000800000;
          auVar58._12_4_ = 0x800000;
          auVar58._16_4_ = 0x800000;
          auVar58._20_4_ = 0x800000;
          auVar58._24_4_ = 0x800000;
          auVar58._28_4_ = 0x800000;
          auVar58 = vmaxps_avx512vl(ZEXT1632(auVar24),auVar58);
          auVar125 = vpsrld_avx2(auVar58,0x17);
          auVar149._8_4_ = 0x807fffff;
          auVar149._0_8_ = 0x807fffff807fffff;
          auVar149._12_4_ = 0x807fffff;
          auVar149._16_4_ = 0x807fffff;
          auVar149._20_4_ = 0x807fffff;
          auVar149._24_4_ = 0x807fffff;
          auVar149._28_4_ = 0x807fffff;
          auVar59._8_4_ = 0x3f000000;
          auVar59._0_8_ = 0x3f0000003f000000;
          auVar59._12_4_ = 0x3f000000;
          auVar59._16_4_ = 0x3f000000;
          auVar59._20_4_ = 0x3f000000;
          auVar59._24_4_ = 0x3f000000;
          auVar59._28_4_ = 0x3f000000;
          auVar58 = vpternlogd_avx512vl(auVar58,auVar149,auVar59,0xea);
          uVar7 = vcmpps_avx512vl(auVar58,auVar68,1);
          auVar59 = vaddps_avx512vl(auVar58,auVar71);
          auVar60 = vaddps_avx512vl(auVar59,auVar58);
          bVar5 = (bool)((byte)uVar7 & 1);
          auVar61._0_4_ = (float)((uint)bVar5 * auVar60._0_4_ | (uint)!bVar5 * auVar59._0_4_);
          bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
          auVar61._4_4_ = (float)((uint)bVar5 * auVar60._4_4_ | (uint)!bVar5 * auVar59._4_4_);
          bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
          auVar61._8_4_ = (float)((uint)bVar5 * auVar60._8_4_ | (uint)!bVar5 * auVar59._8_4_);
          bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
          auVar61._12_4_ = (float)((uint)bVar5 * auVar60._12_4_ | (uint)!bVar5 * auVar59._12_4_);
          bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
          auVar61._16_4_ = (float)((uint)bVar5 * auVar60._16_4_ | (uint)!bVar5 * auVar59._16_4_);
          bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
          auVar61._20_4_ = (float)((uint)bVar5 * auVar60._20_4_ | (uint)!bVar5 * auVar59._20_4_);
          bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
          auVar61._24_4_ = (float)((uint)bVar5 * auVar60._24_4_ | (uint)!bVar5 * auVar59._24_4_);
          bVar5 = SUB81(uVar7 >> 7,0);
          auVar61._28_4_ = (uint)bVar5 * auVar60._28_4_ | (uint)!bVar5 * auVar59._28_4_;
          auVar60._4_4_ = auVar61._4_4_ * auVar61._4_4_;
          auVar60._0_4_ = auVar61._0_4_ * auVar61._0_4_;
          auVar60._8_4_ = auVar61._8_4_ * auVar61._8_4_;
          auVar60._12_4_ = auVar61._12_4_ * auVar61._12_4_;
          auVar60._16_4_ = auVar61._16_4_ * auVar61._16_4_;
          auVar60._20_4_ = auVar61._20_4_ * auVar61._20_4_;
          auVar60._24_4_ = auVar61._24_4_ * auVar61._24_4_;
          auVar60._28_4_ = auVar58._28_4_;
          auVar58 = vfmadd213ps_avx512vl(auVar65,auVar61,auVar72);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar50);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar51);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar52);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar53);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar54);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar55);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar56);
          auVar59 = vmulps_avx512vl(auVar60,auVar61);
          auVar59 = vmulps_avx512vl(auVar59,auVar58);
          auVar58 = vpaddd_avx512vl(auVar125,auVar49);
          auVar58 = vcvtdq2ps_avx(auVar58);
          auVar125 = vsubps_avx512vl(auVar58,auVar106);
          bVar5 = (bool)((byte)uVar7 & 1);
          auVar62._0_4_ = (uint)bVar5 * auVar125._0_4_ | (uint)!bVar5 * auVar58._0_4_;
          bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
          auVar62._4_4_ = (uint)bVar5 * auVar125._4_4_ | (uint)!bVar5 * auVar58._4_4_;
          bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
          auVar62._8_4_ = (uint)bVar5 * auVar125._8_4_ | (uint)!bVar5 * auVar58._8_4_;
          bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
          auVar62._12_4_ = (uint)bVar5 * auVar125._12_4_ | (uint)!bVar5 * auVar58._12_4_;
          bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
          auVar62._16_4_ = (uint)bVar5 * auVar125._16_4_ | (uint)!bVar5 * auVar58._16_4_;
          bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
          auVar62._20_4_ = (uint)bVar5 * auVar125._20_4_ | (uint)!bVar5 * auVar58._20_4_;
          bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
          auVar62._24_4_ = (uint)bVar5 * auVar125._24_4_ | (uint)!bVar5 * auVar58._24_4_;
          bVar5 = SUB81(uVar7 >> 7,0);
          auVar62._28_4_ = (uint)bVar5 * auVar125._28_4_ | (uint)!bVar5 * auVar58._28_4_;
          auVar58 = vfmadd231ps_avx512vl(auVar59,auVar62,auVar114);
          auVar58 = vfmsub231ps_avx512vl(auVar58,auVar70,auVar60);
          auVar58 = vsubps_avx512vl(auVar58,auVar61);
          auVar24 = vfmsub231ps_fma(auVar58,auVar110,auVar62);
          auVar58 = vmulps_avx512vl(ZEXT1632(auVar24),auVar57);
          auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar5 = (bool)((byte)uVar6 & 1);
          auVar63._0_4_ = (uint)bVar5 * auVar59._0_4_ | (uint)!bVar5 * auVar58._0_4_;
          bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar63._4_4_ = (uint)bVar5 * auVar59._4_4_ | (uint)!bVar5 * auVar58._4_4_;
          bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar63._8_4_ = (uint)bVar5 * auVar59._8_4_ | (uint)!bVar5 * auVar58._8_4_;
          bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar63._12_4_ = (uint)bVar5 * auVar59._12_4_ | (uint)!bVar5 * auVar58._12_4_;
          bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
          auVar63._16_4_ = (uint)bVar5 * auVar59._16_4_ | (uint)!bVar5 * auVar58._16_4_;
          bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
          auVar63._20_4_ = (uint)bVar5 * auVar59._20_4_ | (uint)!bVar5 * auVar58._20_4_;
          bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
          auVar63._24_4_ = (uint)bVar5 * auVar59._24_4_ | (uint)!bVar5 * auVar58._24_4_;
          bVar5 = SUB81(uVar6 >> 7,0);
          auVar63._28_4_ = (uint)bVar5 * auVar59._28_4_ | (uint)!bVar5 * auVar58._28_4_;
          auVar58 = vminps_avx(auVar63,auVar67);
          auVar58 = vmaxps_avx(auVar58,auVar69);
          auVar24 = vfmadd213ps_fma(auVar92,auVar58,auVar70);
          auVar59 = vroundps_avx(ZEXT1632(auVar24),1);
          uVar6 = vcmpps_avx512vl(ZEXT1632(auVar24),auVar59,1);
          auVar60 = vsubps_avx512vl(auVar59,auVar106);
          bVar5 = (bool)((byte)uVar6 & 1);
          auVar64._0_4_ = (float)((uint)bVar5 * auVar60._0_4_ | (uint)!bVar5 * auVar59._0_4_);
          bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar64._4_4_ = (float)((uint)bVar5 * auVar60._4_4_ | (uint)!bVar5 * auVar59._4_4_);
          bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar64._8_4_ = (float)((uint)bVar5 * auVar60._8_4_ | (uint)!bVar5 * auVar59._8_4_);
          bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar64._12_4_ = (float)((uint)bVar5 * auVar60._12_4_ | (uint)!bVar5 * auVar59._12_4_);
          bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
          auVar64._16_4_ = (float)((uint)bVar5 * auVar60._16_4_ | (uint)!bVar5 * auVar59._16_4_);
          bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
          auVar64._20_4_ = (float)((uint)bVar5 * auVar60._20_4_ | (uint)!bVar5 * auVar59._20_4_);
          bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
          auVar64._24_4_ = (float)((uint)bVar5 * auVar60._24_4_ | (uint)!bVar5 * auVar59._24_4_);
          bVar5 = SUB81(uVar6 >> 7,0);
          auVar64._28_4_ = (float)((uint)bVar5 * auVar60._28_4_ | (uint)!bVar5 * auVar59._28_4_);
          auVar24 = vfmsub231ps_fma(auVar58,auVar64,auVar110);
          auVar24 = vfnmsub231ps_fma(ZEXT1632(auVar24),auVar64,auVar114);
          auVar59 = ZEXT1632(auVar24);
          auVar58 = vfmadd213ps_avx512vl(auVar153,auVar59,auVar118);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar59,auVar130);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar59,auVar134);
          auVar59 = ZEXT1632(auVar24);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar59,auVar138);
          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar59,auVar70);
          auVar58 = vfmadd213ps_avx512vl
                              (auVar58,ZEXT1632(CONCAT412(auVar24._12_4_ * auVar24._12_4_,
                                                          CONCAT48(auVar24._8_4_ * auVar24._8_4_,
                                                                   CONCAT44(auVar24._4_4_ *
                                                                            auVar24._4_4_,
                                                                            auVar24._0_4_ *
                                                                            auVar24._0_4_)))),
                               auVar59);
          auVar59 = vaddps_avx512vl(auVar58,auVar106);
          auVar126._0_4_ = (int)auVar64._0_4_;
          auVar126._4_4_ = (int)auVar64._4_4_;
          auVar126._8_4_ = (int)auVar64._8_4_;
          auVar126._12_4_ = (int)auVar64._12_4_;
          auVar126._16_4_ = (int)auVar64._16_4_;
          auVar126._20_4_ = (int)auVar64._20_4_;
          auVar126._24_4_ = (int)auVar64._24_4_;
          auVar126._28_4_ = (int)auVar64._28_4_;
          auVar58 = vpslld_avx2(auVar126,0x17);
          auVar58 = vpaddd_avx2(auVar58,auVar142);
          auVar24 = vfmadd213ps_fma(auVar58,auVar59,auVar106);
          auVar58 = vrcpps_avx(ZEXT1632(auVar24));
          auVar24 = vfmsub213ps_fma(ZEXT1632(auVar24),auVar58,auVar106);
          auVar24 = vfnmadd132ps_fma(ZEXT1632(auVar24),auVar58,auVar58);
          auVar58 = vfnmadd213ps_avx512vl(ZEXT1632(auVar24),auVar57,auVar71);
          auVar58 = vmulps_avx512vl(auVar58,*pauVar18);
          *pauVar18 = auVar58;
          pauVar18 = pauVar18 + 1;
        }
      }
    }
    else if (iVar21 == 4) {
      uVar14 = 0;
      uVar20 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar20 = uVar14;
      }
      uVar23 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar23 = uVar14;
      }
      auVar78._8_4_ = 0x42b0c0a5;
      auVar78._0_8_ = 0x42b0c0a542b0c0a5;
      auVar78._12_4_ = 0x42b0c0a5;
      auVar79._8_4_ = 0xc2b0c0a5;
      auVar79._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar79._12_4_ = 0xc2b0c0a5;
      auVar101._8_4_ = 0x3fb8aa3b;
      auVar101._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar101._12_4_ = 0x3fb8aa3b;
      auVar94._8_4_ = 0x3f000000;
      auVar94._0_8_ = 0x3f0000003f000000;
      auVar94._12_4_ = 0x3f000000;
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar108._8_4_ = 0x3f318000;
      auVar108._0_8_ = 0x3f3180003f318000;
      auVar108._12_4_ = 0x3f318000;
      auVar112._8_4_ = 0xb95e8083;
      auVar112._0_8_ = 0xb95e8083b95e8083;
      auVar112._12_4_ = 0xb95e8083;
      auVar116._8_4_ = 0x3ab743ce;
      auVar116._0_8_ = 0x3ab743ce3ab743ce;
      auVar116._12_4_ = 0x3ab743ce;
      auVar151._8_4_ = 0x39506967;
      auVar151._0_8_ = 0x3950696739506967;
      auVar151._12_4_ = 0x39506967;
      auVar128._8_4_ = 0x3c088908;
      auVar128._0_8_ = 0x3c0889083c088908;
      auVar128._12_4_ = 0x3c088908;
      auVar132._8_4_ = 0x3d2aa9c1;
      auVar132._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar132._12_4_ = 0x3d2aa9c1;
      auVar136._8_4_ = 0x3e2aaaaa;
      auVar136._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar136._12_4_ = 0x3e2aaaaa;
      auVar140._8_4_ = 0x3f800000;
      auVar140._0_8_ = 0x3f8000003f800000;
      auVar140._12_4_ = 0x3f800000;
      auVar24 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar27 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar28 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar32 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
        pauVar16 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar17 = uVar20;
        while (iVar21 = (int)uVar17, uVar17 = (ulong)(iVar21 - 1), iVar21 != 0) {
          auVar45 = *pauVar16;
          auVar37 = vminps_avx512vl(auVar45,auVar78);
          auVar38 = vmaxps_avx512vl(auVar37,auVar79);
          auVar39 = vfmadd213ps_avx512vl(auVar101,auVar38,auVar94);
          auVar144._0_4_ = (int)auVar39._0_4_;
          auVar144._4_4_ = (int)auVar39._4_4_;
          auVar144._8_4_ = (int)auVar39._8_4_;
          auVar144._12_4_ = (int)auVar39._12_4_;
          auVar37 = vcvtdq2ps_avx(auVar144);
          uVar6 = vcmpps_avx512vl(auVar39,auVar37,1);
          auVar39 = vsubps_avx512vl(auVar37,auVar105);
          bVar5 = (bool)((byte)uVar6 & 1);
          auVar40._0_4_ = (float)((uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar37._0_4_);
          bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar40._4_4_ = (float)((uint)bVar5 * auVar39._4_4_ | (uint)!bVar5 * auVar37._4_4_);
          bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar40._8_4_ = (float)((uint)bVar5 * auVar39._8_4_ | (uint)!bVar5 * auVar37._8_4_);
          bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar40._12_4_ = (float)((uint)bVar5 * auVar39._12_4_ | (uint)!bVar5 * auVar37._12_4_);
          auVar37 = vfmsub231ps_avx512vl(auVar38,auVar40,auVar108);
          auVar37 = vfnmsub231ps_avx512vl(auVar37,auVar40,auVar112);
          auVar38 = vmulps_avx512vl(auVar37,auVar37);
          auVar39 = vfmadd213ps_avx512vl(auVar151,auVar37,auVar116);
          auVar39 = vfmadd213ps_avx512vl(auVar39,auVar37,auVar128);
          auVar39 = vfmadd213ps_avx512vl(auVar39,auVar37,auVar132);
          auVar39 = vfmadd213ps_avx512vl(auVar39,auVar37,auVar136);
          auVar39 = vfmadd213ps_avx512vl(auVar39,auVar37,auVar94);
          auVar37 = vfmadd213ps_avx512vl(auVar39,auVar38,auVar37);
          auVar84._0_4_ = auVar37._0_4_ + 1.0;
          auVar84._4_4_ = auVar37._4_4_ + 1.0;
          auVar84._8_4_ = auVar37._8_4_ + 1.0;
          auVar84._12_4_ = auVar37._12_4_ + 1.0;
          auVar120._0_4_ = (int)auVar40._0_4_;
          auVar120._4_4_ = (int)auVar40._4_4_;
          auVar120._8_4_ = (int)auVar40._8_4_;
          auVar120._12_4_ = (int)auVar40._12_4_;
          auVar37 = vpslld_avx(auVar120,0x17);
          auVar37 = vpaddd_avx(auVar37,auVar140);
          auVar37 = vfmadd213ps_fma(auVar37,auVar84,auVar105);
          uVar6 = vcmpps_avx512vl(auVar37,_DAT_004ed040,2);
          auVar8._8_4_ = 0x800000;
          auVar8._0_8_ = 0x80000000800000;
          auVar8._12_4_ = 0x800000;
          auVar37 = vmaxps_avx512vl(auVar37,auVar8);
          auVar39 = vpsrld_avx(auVar37,0x17);
          auVar145._8_4_ = 0x807fffff;
          auVar145._0_8_ = 0x807fffff807fffff;
          auVar145._12_4_ = 0x807fffff;
          auVar9._8_4_ = 0x3f000000;
          auVar9._0_8_ = 0x3f0000003f000000;
          auVar9._12_4_ = 0x3f000000;
          auVar37 = vpternlogd_avx512vl(auVar37,auVar145,auVar9,0xea);
          uVar7 = vcmpps_avx512vl(auVar37,auVar25,1);
          auVar38 = vaddps_avx512vl(auVar37,auVar26);
          auVar37 = vaddps_avx512vl(auVar38,auVar37);
          bVar5 = (bool)((byte)uVar7 & 1);
          auVar41._0_4_ = (float)((uint)bVar5 * auVar37._0_4_ | (uint)!bVar5 * auVar38._0_4_);
          bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
          auVar41._4_4_ = (float)((uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * auVar38._4_4_);
          bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
          auVar41._8_4_ = (float)((uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * auVar38._8_4_);
          bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
          auVar41._12_4_ = (float)((uint)bVar5 * auVar37._12_4_ | (uint)!bVar5 * auVar38._12_4_);
          auVar85._0_4_ = auVar41._0_4_ * auVar41._0_4_;
          auVar85._4_4_ = auVar41._4_4_ * auVar41._4_4_;
          auVar85._8_4_ = auVar41._8_4_ * auVar41._8_4_;
          auVar85._12_4_ = auVar41._12_4_ * auVar41._12_4_;
          auVar37 = vfmadd213ps_avx512vl(auVar27,auVar41,auVar28);
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar41,auVar29);
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar41,auVar30);
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar41,auVar31);
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar41,auVar32);
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar41,auVar33);
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar41,auVar34);
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar41,auVar35);
          auVar38 = vmulps_avx512vl(auVar85,auVar41);
          auVar38 = vmulps_avx512vl(auVar38,auVar37);
          auVar37 = vpaddd_avx512vl(auVar39,auVar24);
          auVar37 = vcvtdq2ps_avx(auVar37);
          auVar39 = vsubps_avx512vl(auVar37,auVar105);
          bVar5 = (bool)((byte)uVar7 & 1);
          auVar42._0_4_ = (uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar37._0_4_;
          bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
          auVar42._4_4_ = (uint)bVar5 * auVar39._4_4_ | (uint)!bVar5 * auVar37._4_4_;
          bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
          auVar42._8_4_ = (uint)bVar5 * auVar39._8_4_ | (uint)!bVar5 * auVar37._8_4_;
          bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
          auVar42._12_4_ = (uint)bVar5 * auVar39._12_4_ | (uint)!bVar5 * auVar37._12_4_;
          auVar37 = vfmadd231ps_avx512vl(auVar38,auVar42,auVar112);
          auVar37 = vfmsub231ps_avx512vl(auVar37,auVar94,auVar85);
          auVar37 = vsubps_avx512vl(auVar37,auVar41);
          auVar37 = vfnmadd231ps_fma(auVar37,auVar108,auVar42);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar5 = (bool)((byte)uVar6 & 1);
          auVar43._0_4_ =
               (uint)bVar5 * auVar38._0_4_ | (uint)!bVar5 * (int)(auVar37._0_4_ + auVar37._0_4_);
          bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar43._4_4_ =
               (uint)bVar5 * auVar38._4_4_ | (uint)!bVar5 * (int)(auVar37._4_4_ + auVar37._4_4_);
          bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar43._8_4_ =
               (uint)bVar5 * auVar38._8_4_ | (uint)!bVar5 * (int)(auVar37._8_4_ + auVar37._8_4_);
          bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar43._12_4_ =
               (uint)bVar5 * auVar38._12_4_ | (uint)!bVar5 * (int)(auVar37._12_4_ + auVar37._12_4_);
          auVar37 = vminps_avx(auVar43,auVar78);
          auVar38 = vmaxps_avx(auVar37,auVar79);
          auVar39 = vfmadd213ps_fma(auVar101,auVar38,auVar94);
          auVar146._0_4_ = (int)auVar39._0_4_;
          auVar146._4_4_ = (int)auVar39._4_4_;
          auVar146._8_4_ = (int)auVar39._8_4_;
          auVar146._12_4_ = (int)auVar39._12_4_;
          auVar37 = vcvtdq2ps_avx(auVar146);
          uVar6 = vcmpps_avx512vl(auVar39,auVar37,1);
          auVar39 = vsubps_avx512vl(auVar37,auVar105);
          bVar5 = (bool)((byte)uVar6 & 1);
          auVar44._0_4_ = (float)((uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar37._0_4_);
          bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar44._4_4_ = (float)((uint)bVar5 * auVar39._4_4_ | (uint)!bVar5 * auVar37._4_4_);
          bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar44._8_4_ = (float)((uint)bVar5 * auVar39._8_4_ | (uint)!bVar5 * auVar37._8_4_);
          bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar44._12_4_ = (float)((uint)bVar5 * auVar39._12_4_ | (uint)!bVar5 * auVar37._12_4_);
          auVar37 = vfmsub231ps_fma(auVar38,auVar44,auVar108);
          auVar37 = vfnmsub231ps_fma(auVar37,auVar44,auVar112);
          auVar121._0_4_ = auVar37._0_4_ * auVar37._0_4_;
          auVar121._4_4_ = auVar37._4_4_ * auVar37._4_4_;
          auVar121._8_4_ = auVar37._8_4_ * auVar37._8_4_;
          auVar121._12_4_ = auVar37._12_4_ * auVar37._12_4_;
          auVar38 = vfmadd213ps_avx512vl(auVar151,auVar37,auVar116);
          auVar38 = vfmadd213ps_avx512vl(auVar38,auVar37,auVar128);
          auVar38 = vfmadd213ps_avx512vl(auVar38,auVar37,auVar132);
          auVar38 = vfmadd213ps_avx512vl(auVar38,auVar37,auVar136);
          auVar38 = vfmadd213ps_avx512vl(auVar38,auVar37,auVar94);
          auVar37 = vfmadd213ps_avx512vl(auVar38,auVar121,auVar37);
          auVar38 = vaddps_avx512vl(auVar37,auVar105);
          auVar122._0_4_ = (int)auVar44._0_4_;
          auVar122._4_4_ = (int)auVar44._4_4_;
          auVar122._8_4_ = (int)auVar44._8_4_;
          auVar122._12_4_ = (int)auVar44._12_4_;
          auVar37 = vpslld_avx(auVar122,0x17);
          auVar37 = vpaddd_avx(auVar37,auVar140);
          auVar38 = vfmadd213ps_fma(auVar37,auVar38,auVar105);
          auVar37 = vrcpps_avx(auVar38);
          auVar147._0_4_ = auVar37._0_4_ + auVar37._0_4_;
          auVar147._4_4_ = auVar37._4_4_ + auVar37._4_4_;
          auVar147._8_4_ = auVar37._8_4_ + auVar37._8_4_;
          auVar147._12_4_ = auVar37._12_4_ + auVar37._12_4_;
          auVar38 = vfmsub213ps_avx512vl(auVar38,auVar147,auVar36);
          auVar37 = vfnmadd213ps_fma(auVar38,auVar37,auVar147);
          auVar45 = vfmsub213ps_avx512vl(auVar37,auVar45,auVar45);
          *pauVar16 = auVar45;
          pauVar16 = pauVar16 + 1;
        }
      }
    }
    else {
      uVar14 = 0;
      uVar20 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar20 = uVar14;
      }
      for (; uVar14 != uVar20; uVar14 = uVar14 + 1) {
        pvVar2 = bottom_top_blob->data;
        sVar3 = bottom_top_blob->elemsize;
        sVar4 = bottom_top_blob->cstep;
        pauVar18 = (undefined1 (*) [32])(sVar4 * uVar14 * sVar3 + (long)pvVar2);
        lVar22 = 0;
        for (iVar21 = 0; iVar21 + 7 < (int)uVar19; iVar21 = iVar21 + 8) {
          auVar49 = *pauVar18;
          auVar111._8_4_ = 0x42b0c0a5;
          auVar111._0_8_ = 0x42b0c0a542b0c0a5;
          auVar111._12_4_ = 0x42b0c0a5;
          auVar111._16_4_ = 0x42b0c0a5;
          auVar111._20_4_ = 0x42b0c0a5;
          auVar111._24_4_ = 0x42b0c0a5;
          auVar111._28_4_ = 0x42b0c0a5;
          auVar68 = vminps_avx(auVar49,auVar111);
          auVar115._8_4_ = 0xc2b0c0a5;
          auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar115._12_4_ = 0xc2b0c0a5;
          auVar115._16_4_ = 0xc2b0c0a5;
          auVar115._20_4_ = 0xc2b0c0a5;
          auVar115._24_4_ = 0xc2b0c0a5;
          auVar115._28_4_ = 0xc2b0c0a5;
          auVar68 = vmaxps_avx(auVar68,auVar115);
          auVar127._8_4_ = 0x3fb8aa3b;
          auVar127._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar127._12_4_ = 0x3fb8aa3b;
          auVar127._16_4_ = 0x3fb8aa3b;
          auVar127._20_4_ = 0x3fb8aa3b;
          auVar127._24_4_ = 0x3fb8aa3b;
          auVar127._28_4_ = 0x3fb8aa3b;
          auVar119._8_4_ = 0x3f000000;
          auVar119._0_8_ = 0x3f0000003f000000;
          auVar119._12_4_ = 0x3f000000;
          auVar119._16_4_ = 0x3f000000;
          auVar119._20_4_ = 0x3f000000;
          auVar119._24_4_ = 0x3f000000;
          auVar119._28_4_ = 0x3f000000;
          auVar24 = vfmadd213ps_fma(auVar127,auVar68,auVar119);
          auVar71 = vroundps_avx(ZEXT1632(auVar24),1);
          uVar23 = vcmpps_avx512vl(ZEXT1632(auVar24),auVar71,1);
          auVar131._8_4_ = 0x3f800000;
          auVar131._0_8_ = 0x3f8000003f800000;
          auVar131._12_4_ = 0x3f800000;
          auVar131._16_4_ = 0x3f800000;
          auVar131._20_4_ = 0x3f800000;
          auVar131._24_4_ = 0x3f800000;
          auVar131._28_4_ = 0x3f800000;
          auVar65 = vsubps_avx512vl(auVar71,auVar131);
          bVar5 = (bool)((byte)uVar23 & 1);
          auVar66._0_4_ = (float)((uint)bVar5 * auVar65._0_4_ | (uint)!bVar5 * auVar71._0_4_);
          bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar66._4_4_ = (float)((uint)bVar5 * auVar65._4_4_ | (uint)!bVar5 * auVar71._4_4_);
          bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar66._8_4_ = (float)((uint)bVar5 * auVar65._8_4_ | (uint)!bVar5 * auVar71._8_4_);
          bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar66._12_4_ = (float)((uint)bVar5 * auVar65._12_4_ | (uint)!bVar5 * auVar71._12_4_);
          bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar66._16_4_ = (float)((uint)bVar5 * auVar65._16_4_ | (uint)!bVar5 * auVar71._16_4_);
          bVar5 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar66._20_4_ = (float)((uint)bVar5 * auVar65._20_4_ | (uint)!bVar5 * auVar71._20_4_);
          bVar5 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar66._24_4_ = (float)((uint)bVar5 * auVar65._24_4_ | (uint)!bVar5 * auVar71._24_4_);
          bVar5 = SUB81(uVar23 >> 7,0);
          auVar66._28_4_ = (float)((uint)bVar5 * auVar65._28_4_ | (uint)!bVar5 * auVar71._28_4_);
          auVar135._8_4_ = 0x3f318000;
          auVar135._0_8_ = 0x3f3180003f318000;
          auVar135._12_4_ = 0x3f318000;
          auVar135._16_4_ = 0x3f318000;
          auVar135._20_4_ = 0x3f318000;
          auVar135._24_4_ = 0x3f318000;
          auVar135._28_4_ = 0x3f318000;
          auVar24 = vfmsub231ps_fma(auVar68,auVar66,auVar135);
          auVar139._8_4_ = 0xb95e8083;
          auVar139._0_8_ = 0xb95e8083b95e8083;
          auVar139._12_4_ = 0xb95e8083;
          auVar139._16_4_ = 0xb95e8083;
          auVar139._20_4_ = 0xb95e8083;
          auVar139._24_4_ = 0xb95e8083;
          auVar139._28_4_ = 0xb95e8083;
          auVar25 = vfnmsub231ps_fma(ZEXT1632(auVar24),auVar66,auVar139);
          auVar68 = ZEXT1632(auVar25);
          auVar150._8_4_ = 0x39506967;
          auVar150._0_8_ = 0x3950696739506967;
          auVar150._12_4_ = 0x39506967;
          auVar150._16_4_ = 0x39506967;
          auVar150._20_4_ = 0x39506967;
          auVar150._24_4_ = 0x39506967;
          auVar150._28_4_ = 0x39506967;
          auVar143._8_4_ = 0x3ab743ce;
          auVar143._0_8_ = 0x3ab743ce3ab743ce;
          auVar143._12_4_ = 0x3ab743ce;
          auVar143._16_4_ = 0x3ab743ce;
          auVar143._20_4_ = 0x3ab743ce;
          auVar143._24_4_ = 0x3ab743ce;
          auVar143._28_4_ = 0x3ab743ce;
          auVar24 = vfmadd213ps_fma(auVar150,auVar68,auVar143);
          auVar154._8_4_ = 0x3c088908;
          auVar154._0_8_ = 0x3c0889083c088908;
          auVar154._12_4_ = 0x3c088908;
          auVar154._16_4_ = 0x3c088908;
          auVar154._20_4_ = 0x3c088908;
          auVar154._24_4_ = 0x3c088908;
          auVar154._28_4_ = 0x3c088908;
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar68,auVar154);
          auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar68 = vfmadd213ps_avx512vl(ZEXT1632(auVar24),auVar68,auVar67);
          auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar71 = ZEXT1632(auVar25);
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar71,auVar69);
          auVar24 = vfmadd213ps_fma(auVar68,auVar71,auVar119);
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),
                                    ZEXT1632(CONCAT412(auVar25._12_4_ * auVar25._12_4_,
                                                       CONCAT48(auVar25._8_4_ * auVar25._8_4_,
                                                                CONCAT44(auVar25._4_4_ *
                                                                         auVar25._4_4_,
                                                                         auVar25._0_4_ *
                                                                         auVar25._0_4_)))),auVar71);
          auVar82._0_4_ = auVar24._0_4_ + 1.0;
          auVar82._4_4_ = auVar24._4_4_ + 1.0;
          auVar82._8_4_ = auVar24._8_4_ + 1.0;
          auVar82._12_4_ = auVar24._12_4_ + 1.0;
          auVar82._16_4_ = 0x3f800000;
          auVar82._20_4_ = 0x3f800000;
          auVar82._24_4_ = 0x3f800000;
          auVar82._28_4_ = 0x3f800000;
          auVar91._0_4_ = (int)auVar66._0_4_;
          auVar91._4_4_ = (int)auVar66._4_4_;
          auVar91._8_4_ = (int)auVar66._8_4_;
          auVar91._12_4_ = (int)auVar66._12_4_;
          auVar91._16_4_ = (int)auVar66._16_4_;
          auVar91._20_4_ = (int)auVar66._20_4_;
          auVar91._24_4_ = (int)auVar66._24_4_;
          auVar91._28_4_ = (int)auVar66._28_4_;
          auVar68 = vpslld_avx2(auVar91,0x17);
          auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar68 = vpaddd_avx512vl(auVar68,auVar70);
          auVar24 = vfmadd213ps_fma(auVar68,auVar82,auVar131);
          uVar23 = vcmpps_avx512vl(ZEXT1632(auVar24),_DAT_004f1800,2);
          auVar68._8_4_ = 0x800000;
          auVar68._0_8_ = 0x80000000800000;
          auVar68._12_4_ = 0x800000;
          auVar68._16_4_ = 0x800000;
          auVar68._20_4_ = 0x800000;
          auVar68._24_4_ = 0x800000;
          auVar68._28_4_ = 0x800000;
          auVar68 = vmaxps_avx512vl(ZEXT1632(auVar24),auVar68);
          auVar92 = vpsrld_avx2(auVar68,0x17);
          auVar100._8_4_ = 0x807fffff;
          auVar100._0_8_ = 0x807fffff807fffff;
          auVar100._12_4_ = 0x807fffff;
          auVar100._16_4_ = 0x807fffff;
          auVar100._20_4_ = 0x807fffff;
          auVar100._24_4_ = 0x807fffff;
          auVar100._28_4_ = 0x807fffff;
          auVar71._8_4_ = 0x3f000000;
          auVar71._0_8_ = 0x3f0000003f000000;
          auVar71._12_4_ = 0x3f000000;
          auVar71._16_4_ = 0x3f000000;
          auVar71._20_4_ = 0x3f000000;
          auVar71._24_4_ = 0x3f000000;
          auVar71._28_4_ = 0x3f000000;
          auVar68 = vpternlogd_avx512vl(auVar68,auVar100,auVar71,0xea);
          auVar65._8_4_ = 0x3f3504f3;
          auVar65._0_8_ = 0x3f3504f33f3504f3;
          auVar65._12_4_ = 0x3f3504f3;
          auVar65._16_4_ = 0x3f3504f3;
          auVar65._20_4_ = 0x3f3504f3;
          auVar65._24_4_ = 0x3f3504f3;
          auVar65._28_4_ = 0x3f3504f3;
          uVar17 = vcmpps_avx512vl(auVar68,auVar65,1);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar71 = vaddps_avx512vl(auVar68,auVar65);
          auVar72 = vaddps_avx512vl(auVar71,auVar68);
          bVar5 = (bool)((byte)uVar17 & 1);
          auVar73._0_4_ = (float)((uint)bVar5 * auVar72._0_4_ | (uint)!bVar5 * auVar71._0_4_);
          bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar73._4_4_ = (float)((uint)bVar5 * auVar72._4_4_ | (uint)!bVar5 * auVar71._4_4_);
          bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar73._8_4_ = (float)((uint)bVar5 * auVar72._8_4_ | (uint)!bVar5 * auVar71._8_4_);
          bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar73._12_4_ = (float)((uint)bVar5 * auVar72._12_4_ | (uint)!bVar5 * auVar71._12_4_);
          bVar5 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar73._16_4_ = (float)((uint)bVar5 * auVar72._16_4_ | (uint)!bVar5 * auVar71._16_4_);
          bVar5 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar73._20_4_ = (float)((uint)bVar5 * auVar72._20_4_ | (uint)!bVar5 * auVar71._20_4_);
          bVar5 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar73._24_4_ = (float)((uint)bVar5 * auVar72._24_4_ | (uint)!bVar5 * auVar71._24_4_);
          bVar5 = SUB81(uVar17 >> 7,0);
          auVar73._28_4_ = (uint)bVar5 * auVar72._28_4_ | (uint)!bVar5 * auVar71._28_4_;
          auVar10._4_4_ = auVar73._4_4_ * auVar73._4_4_;
          auVar10._0_4_ = auVar73._0_4_ * auVar73._0_4_;
          auVar10._8_4_ = auVar73._8_4_ * auVar73._8_4_;
          auVar10._12_4_ = auVar73._12_4_ * auVar73._12_4_;
          auVar10._16_4_ = auVar73._16_4_ * auVar73._16_4_;
          auVar10._20_4_ = auVar73._20_4_ * auVar73._20_4_;
          auVar10._24_4_ = auVar73._24_4_ * auVar73._24_4_;
          auVar10._28_4_ = auVar68._28_4_;
          auVar104._8_4_ = 0x3d9021bb;
          auVar104._0_8_ = 0x3d9021bb3d9021bb;
          auVar104._12_4_ = 0x3d9021bb;
          auVar104._16_4_ = 0x3d9021bb;
          auVar104._20_4_ = 0x3d9021bb;
          auVar104._24_4_ = 0x3d9021bb;
          auVar104._28_4_ = 0x3d9021bb;
          auVar72._8_4_ = 0xbdebd1b8;
          auVar72._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar72._12_4_ = 0xbdebd1b8;
          auVar72._16_4_ = 0xbdebd1b8;
          auVar72._20_4_ = 0xbdebd1b8;
          auVar72._24_4_ = 0xbdebd1b8;
          auVar72._28_4_ = 0xbdebd1b8;
          auVar68 = vfmadd213ps_avx512vl(auVar104,auVar73,auVar72);
          auVar50._8_4_ = 0x3def251a;
          auVar50._0_8_ = 0x3def251a3def251a;
          auVar50._12_4_ = 0x3def251a;
          auVar50._16_4_ = 0x3def251a;
          auVar50._20_4_ = 0x3def251a;
          auVar50._24_4_ = 0x3def251a;
          auVar50._28_4_ = 0x3def251a;
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar73,auVar50);
          auVar51._8_4_ = 0xbdfe5d4f;
          auVar51._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar51._12_4_ = 0xbdfe5d4f;
          auVar51._16_4_ = 0xbdfe5d4f;
          auVar51._20_4_ = 0xbdfe5d4f;
          auVar51._24_4_ = 0xbdfe5d4f;
          auVar51._28_4_ = 0xbdfe5d4f;
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar73,auVar51);
          auVar52._8_4_ = 0x3e11e9bf;
          auVar52._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar52._12_4_ = 0x3e11e9bf;
          auVar52._16_4_ = 0x3e11e9bf;
          auVar52._20_4_ = 0x3e11e9bf;
          auVar52._24_4_ = 0x3e11e9bf;
          auVar52._28_4_ = 0x3e11e9bf;
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar73,auVar52);
          auVar53._8_4_ = 0xbe2aae50;
          auVar53._0_8_ = 0xbe2aae50be2aae50;
          auVar53._12_4_ = 0xbe2aae50;
          auVar53._16_4_ = 0xbe2aae50;
          auVar53._20_4_ = 0xbe2aae50;
          auVar53._24_4_ = 0xbe2aae50;
          auVar53._28_4_ = 0xbe2aae50;
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar73,auVar53);
          auVar54._8_4_ = 0x3e4cceac;
          auVar54._0_8_ = 0x3e4cceac3e4cceac;
          auVar54._12_4_ = 0x3e4cceac;
          auVar54._16_4_ = 0x3e4cceac;
          auVar54._20_4_ = 0x3e4cceac;
          auVar54._24_4_ = 0x3e4cceac;
          auVar54._28_4_ = 0x3e4cceac;
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar73,auVar54);
          auVar55._8_4_ = 0xbe7ffffc;
          auVar55._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar55._12_4_ = 0xbe7ffffc;
          auVar55._16_4_ = 0xbe7ffffc;
          auVar55._20_4_ = 0xbe7ffffc;
          auVar55._24_4_ = 0xbe7ffffc;
          auVar55._28_4_ = 0xbe7ffffc;
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar73,auVar55);
          auVar56._8_4_ = 0x3eaaaaaa;
          auVar56._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar56._12_4_ = 0x3eaaaaaa;
          auVar56._16_4_ = 0x3eaaaaaa;
          auVar56._20_4_ = 0x3eaaaaaa;
          auVar56._24_4_ = 0x3eaaaaaa;
          auVar56._28_4_ = 0x3eaaaaaa;
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar73,auVar56);
          auVar11._4_4_ = auVar73._4_4_ * auVar73._4_4_ * auVar73._4_4_ * auVar68._4_4_;
          auVar11._0_4_ = auVar73._0_4_ * auVar73._0_4_ * auVar73._0_4_ * auVar68._0_4_;
          auVar11._8_4_ = auVar73._8_4_ * auVar73._8_4_ * auVar73._8_4_ * auVar68._8_4_;
          auVar11._12_4_ = auVar73._12_4_ * auVar73._12_4_ * auVar73._12_4_ * auVar68._12_4_;
          auVar11._16_4_ = auVar73._16_4_ * auVar73._16_4_ * auVar73._16_4_ * auVar68._16_4_;
          auVar11._20_4_ = auVar73._20_4_ * auVar73._20_4_ * auVar73._20_4_ * auVar68._20_4_;
          auVar11._24_4_ = auVar73._24_4_ * auVar73._24_4_ * auVar73._24_4_ * auVar68._24_4_;
          auVar11._28_4_ = auVar68._28_4_;
          auVar57._8_4_ = 0xffffff82;
          auVar57._0_8_ = 0xffffff82ffffff82;
          auVar57._12_4_ = 0xffffff82;
          auVar57._16_4_ = 0xffffff82;
          auVar57._20_4_ = 0xffffff82;
          auVar57._24_4_ = 0xffffff82;
          auVar57._28_4_ = 0xffffff82;
          auVar68 = vpaddd_avx512vl(auVar92,auVar57);
          auVar68 = vcvtdq2ps_avx(auVar68);
          auVar71 = vsubps_avx512vl(auVar68,auVar131);
          bVar5 = (bool)((byte)uVar17 & 1);
          auVar74._0_4_ = (uint)bVar5 * auVar71._0_4_ | (uint)!bVar5 * auVar68._0_4_;
          bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar74._4_4_ = (uint)bVar5 * auVar71._4_4_ | (uint)!bVar5 * auVar68._4_4_;
          bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar74._8_4_ = (uint)bVar5 * auVar71._8_4_ | (uint)!bVar5 * auVar68._8_4_;
          bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar74._12_4_ = (uint)bVar5 * auVar71._12_4_ | (uint)!bVar5 * auVar68._12_4_;
          bVar5 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar74._16_4_ = (uint)bVar5 * auVar71._16_4_ | (uint)!bVar5 * auVar68._16_4_;
          bVar5 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar74._20_4_ = (uint)bVar5 * auVar71._20_4_ | (uint)!bVar5 * auVar68._20_4_;
          bVar5 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar74._24_4_ = (uint)bVar5 * auVar71._24_4_ | (uint)!bVar5 * auVar68._24_4_;
          bVar5 = SUB81(uVar17 >> 7,0);
          auVar74._28_4_ = (uint)bVar5 * auVar71._28_4_ | (uint)!bVar5 * auVar68._28_4_;
          auVar24 = vfmadd231ps_fma(auVar11,auVar74,auVar139);
          auVar24 = vfmsub231ps_fma(ZEXT1632(auVar24),auVar119,auVar10);
          auVar68 = vsubps_avx(ZEXT1632(auVar24),auVar73);
          auVar24 = vfmsub231ps_fma(auVar68,auVar135,auVar74);
          auVar107._8_4_ = 0xc0000000;
          auVar107._0_8_ = 0xc0000000c0000000;
          auVar107._12_4_ = 0xc0000000;
          auVar107._16_4_ = 0xc0000000;
          auVar107._20_4_ = 0xc0000000;
          auVar107._24_4_ = 0xc0000000;
          auVar107._28_4_ = 0xc0000000;
          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar5 = (bool)((byte)uVar23 & 1);
          auVar75._0_4_ = (uint)bVar5 * auVar68._0_4_ | (uint)!bVar5 * (int)(auVar24._0_4_ * -2.0);
          bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar75._4_4_ = (uint)bVar5 * auVar68._4_4_ | (uint)!bVar5 * (int)(auVar24._4_4_ * -2.0);
          bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar75._8_4_ = (uint)bVar5 * auVar68._8_4_ | (uint)!bVar5 * (int)(auVar24._8_4_ * -2.0);
          bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar75._12_4_ =
               (uint)bVar5 * auVar68._12_4_ | (uint)!bVar5 * (int)(auVar24._12_4_ * -2.0);
          bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar75._16_4_ = (uint)bVar5 * auVar68._16_4_ | (uint)!bVar5 * -0x80000000;
          bVar5 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar75._20_4_ = (uint)bVar5 * auVar68._20_4_ | (uint)!bVar5 * -0x80000000;
          bVar5 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar75._24_4_ = (uint)bVar5 * auVar68._24_4_ | (uint)!bVar5 * -0x80000000;
          auVar75._28_4_ = (uint)(byte)(uVar23 >> 7) * auVar68._28_4_;
          auVar68 = vminps_avx(auVar75,auVar111);
          auVar68 = vmaxps_avx(auVar68,auVar115);
          auVar24 = vfmadd213ps_fma(auVar127,auVar68,auVar119);
          auVar71 = vroundps_avx(ZEXT1632(auVar24),1);
          uVar23 = vcmpps_avx512vl(ZEXT1632(auVar24),auVar71,1);
          auVar72 = vsubps_avx512vl(auVar71,auVar131);
          bVar5 = (bool)((byte)uVar23 & 1);
          auVar76._0_4_ = (float)((uint)bVar5 * auVar72._0_4_ | (uint)!bVar5 * auVar71._0_4_);
          bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar76._4_4_ = (float)((uint)bVar5 * auVar72._4_4_ | (uint)!bVar5 * auVar71._4_4_);
          bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar76._8_4_ = (float)((uint)bVar5 * auVar72._8_4_ | (uint)!bVar5 * auVar71._8_4_);
          bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar76._12_4_ = (float)((uint)bVar5 * auVar72._12_4_ | (uint)!bVar5 * auVar71._12_4_);
          bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar76._16_4_ = (float)((uint)bVar5 * auVar72._16_4_ | (uint)!bVar5 * auVar71._16_4_);
          bVar5 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar76._20_4_ = (float)((uint)bVar5 * auVar72._20_4_ | (uint)!bVar5 * auVar71._20_4_);
          bVar5 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar76._24_4_ = (float)((uint)bVar5 * auVar72._24_4_ | (uint)!bVar5 * auVar71._24_4_);
          bVar5 = SUB81(uVar23 >> 7,0);
          auVar76._28_4_ = (float)((uint)bVar5 * auVar72._28_4_ | (uint)!bVar5 * auVar71._28_4_);
          auVar24 = vfmsub231ps_fma(auVar68,auVar76,auVar135);
          auVar25 = vfnmsub231ps_fma(ZEXT1632(auVar24),auVar76,auVar139);
          auVar68 = ZEXT1632(auVar25);
          auVar24 = vfmadd213ps_fma(auVar150,auVar68,auVar143);
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar68,auVar154);
          auVar68 = vfmadd213ps_avx512vl(ZEXT1632(auVar24),auVar68,auVar67);
          auVar71 = ZEXT1632(auVar25);
          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar71,auVar69);
          auVar24 = vfmadd213ps_fma(auVar68,auVar71,auVar119);
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),
                                    ZEXT1632(CONCAT412(auVar25._12_4_ * auVar25._12_4_,
                                                       CONCAT48(auVar25._8_4_ * auVar25._8_4_,
                                                                CONCAT44(auVar25._4_4_ *
                                                                         auVar25._4_4_,
                                                                         auVar25._0_4_ *
                                                                         auVar25._0_4_)))),auVar71);
          auVar83._0_4_ = auVar24._0_4_ + 1.0;
          auVar83._4_4_ = auVar24._4_4_ + 1.0;
          auVar83._8_4_ = auVar24._8_4_ + 1.0;
          auVar83._12_4_ = auVar24._12_4_ + 1.0;
          auVar83._16_4_ = 0x3f800000;
          auVar83._20_4_ = 0x3f800000;
          auVar83._24_4_ = 0x3f800000;
          auVar83._28_4_ = 0x3f800000;
          auVar93._0_4_ = (int)auVar76._0_4_;
          auVar93._4_4_ = (int)auVar76._4_4_;
          auVar93._8_4_ = (int)auVar76._8_4_;
          auVar93._12_4_ = (int)auVar76._12_4_;
          auVar93._16_4_ = (int)auVar76._16_4_;
          auVar93._20_4_ = (int)auVar76._20_4_;
          auVar93._24_4_ = (int)auVar76._24_4_;
          auVar93._28_4_ = (int)auVar76._28_4_;
          auVar68 = vpslld_avx2(auVar93,0x17);
          auVar68 = vpaddd_avx512vl(auVar68,auVar70);
          auVar24 = vfmadd213ps_fma(auVar68,auVar83,auVar131);
          auVar68 = vrcpps_avx(ZEXT1632(auVar24));
          auVar24 = vfmsub213ps_fma(ZEXT1632(auVar24),auVar68,auVar131);
          auVar24 = vfnmadd132ps_fma(ZEXT1632(auVar24),auVar68,auVar68);
          auVar68 = vfnmadd213ps_avx512vl(ZEXT1632(auVar24),auVar107,auVar65);
          auVar12._4_4_ = auVar68._4_4_ * auVar49._4_4_;
          auVar12._0_4_ = auVar68._0_4_ * auVar49._0_4_;
          auVar12._8_4_ = auVar68._8_4_ * auVar49._8_4_;
          auVar12._12_4_ = auVar68._12_4_ * auVar49._12_4_;
          auVar12._16_4_ = auVar68._16_4_ * auVar49._16_4_;
          auVar12._20_4_ = auVar68._20_4_ * auVar49._20_4_;
          auVar12._24_4_ = auVar68._24_4_ * auVar49._24_4_;
          auVar12._28_4_ = auVar49._28_4_;
          *pauVar18 = auVar12;
          pauVar18 = pauVar18 + 1;
          lVar22 = lVar22 + 8;
        }
        for (; iVar21 + 3 < (int)uVar19; iVar21 = iVar21 + 4) {
          auVar24 = *(undefined1 (*) [16])*pauVar18;
          auVar109._8_4_ = 0x42b0c0a5;
          auVar109._0_8_ = 0x42b0c0a542b0c0a5;
          auVar109._12_4_ = 0x42b0c0a5;
          auVar25 = vminps_avx(auVar24,auVar109);
          auVar113._8_4_ = 0xc2b0c0a5;
          auVar113._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar113._12_4_ = 0xc2b0c0a5;
          auVar26 = vmaxps_avx(auVar25,auVar113);
          auVar117._8_4_ = 0x3fb8aa3b;
          auVar117._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar117._12_4_ = 0x3fb8aa3b;
          auVar123._8_4_ = 0x3f000000;
          auVar123._0_8_ = 0x3f0000003f000000;
          auVar123._12_4_ = 0x3f000000;
          auVar27 = vfmadd213ps_fma(auVar117,auVar26,auVar123);
          auVar95._0_4_ = (int)auVar27._0_4_;
          auVar95._4_4_ = (int)auVar27._4_4_;
          auVar95._8_4_ = (int)auVar27._8_4_;
          auVar95._12_4_ = (int)auVar27._12_4_;
          auVar25 = vcvtdq2ps_avx(auVar95);
          uVar23 = vcmpps_avx512vl(auVar27,auVar25,1);
          auVar129._8_4_ = 0x3f800000;
          auVar129._0_8_ = 0x3f8000003f800000;
          auVar129._12_4_ = 0x3f800000;
          auVar27 = vsubps_avx512vl(auVar25,auVar129);
          bVar5 = (bool)((byte)uVar23 & 1);
          auVar38._0_4_ = (float)((uint)bVar5 * auVar27._0_4_ | (uint)!bVar5 * auVar25._0_4_);
          bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar38._4_4_ = (float)((uint)bVar5 * auVar27._4_4_ | (uint)!bVar5 * auVar25._4_4_);
          bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar38._8_4_ = (float)((uint)bVar5 * auVar27._8_4_ | (uint)!bVar5 * auVar25._8_4_);
          bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar38._12_4_ = (float)((uint)bVar5 * auVar27._12_4_ | (uint)!bVar5 * auVar25._12_4_);
          auVar133._8_4_ = 0x3f318000;
          auVar133._0_8_ = 0x3f3180003f318000;
          auVar133._12_4_ = 0x3f318000;
          auVar25 = vfmsub231ps_fma(auVar26,auVar38,auVar133);
          auVar137._8_4_ = 0xb95e8083;
          auVar137._0_8_ = 0xb95e8083b95e8083;
          auVar137._12_4_ = 0xb95e8083;
          auVar26 = vfnmsub231ps_fma(auVar25,auVar38,auVar137);
          auVar86._0_4_ = auVar26._0_4_ * auVar26._0_4_;
          auVar86._4_4_ = auVar26._4_4_ * auVar26._4_4_;
          auVar86._8_4_ = auVar26._8_4_ * auVar26._8_4_;
          auVar86._12_4_ = auVar26._12_4_ * auVar26._12_4_;
          auVar148._8_4_ = 0x39506967;
          auVar148._0_8_ = 0x3950696739506967;
          auVar148._12_4_ = 0x39506967;
          auVar141._8_4_ = 0x3ab743ce;
          auVar141._0_8_ = 0x3ab743ce3ab743ce;
          auVar141._12_4_ = 0x3ab743ce;
          auVar25 = vfmadd213ps_fma(auVar148,auVar26,auVar141);
          auVar152._8_4_ = 0x3c088908;
          auVar152._0_8_ = 0x3c0889083c088908;
          auVar152._12_4_ = 0x3c088908;
          auVar25 = vfmadd213ps_fma(auVar25,auVar26,auVar152);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar26,auVar37);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar26,auVar39);
          auVar25 = vfmadd213ps_fma(auVar25,auVar26,auVar123);
          auVar25 = vfmadd213ps_fma(auVar25,auVar86,auVar26);
          auVar80._0_4_ = auVar25._0_4_ + 1.0;
          auVar80._4_4_ = auVar25._4_4_ + 1.0;
          auVar80._8_4_ = auVar25._8_4_ + 1.0;
          auVar80._12_4_ = auVar25._12_4_ + 1.0;
          auVar87._0_4_ = (int)auVar38._0_4_;
          auVar87._4_4_ = (int)auVar38._4_4_;
          auVar87._8_4_ = (int)auVar38._8_4_;
          auVar87._12_4_ = (int)auVar38._12_4_;
          auVar25 = vpslld_avx(auVar87,0x17);
          auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar25 = vpaddd_avx512vl(auVar25,auVar38);
          auVar25 = vfmadd213ps_fma(auVar25,auVar80,auVar129);
          uVar23 = vcmpps_avx512vl(auVar25,_DAT_004ed040,2);
          auVar26._8_4_ = 0x800000;
          auVar26._0_8_ = 0x80000000800000;
          auVar26._12_4_ = 0x800000;
          auVar26 = vmaxps_avx512vl(auVar25,auVar26);
          auVar88 = vpsrld_avx(auVar26,0x17);
          auVar96._8_4_ = 0x807fffff;
          auVar96._0_8_ = 0x807fffff807fffff;
          auVar96._12_4_ = 0x807fffff;
          auVar25._8_4_ = 0x3f000000;
          auVar25._0_8_ = 0x3f0000003f000000;
          auVar25._12_4_ = 0x3f000000;
          auVar25 = vpternlogd_avx512vl(auVar26,auVar96,auVar25,0xea);
          auVar27._8_4_ = 0x3f3504f3;
          auVar27._0_8_ = 0x3f3504f33f3504f3;
          auVar27._12_4_ = 0x3f3504f3;
          uVar17 = vcmpps_avx512vl(auVar25,auVar27,1);
          auVar28._8_4_ = 0xbf800000;
          auVar28._0_8_ = 0xbf800000bf800000;
          auVar28._12_4_ = 0xbf800000;
          auVar26 = vaddps_avx512vl(auVar25,auVar28);
          auVar25 = vaddps_avx512vl(auVar26,auVar25);
          bVar5 = (bool)((byte)uVar17 & 1);
          auVar46._0_4_ = (float)((uint)bVar5 * auVar25._0_4_ | (uint)!bVar5 * auVar26._0_4_);
          bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar46._4_4_ = (float)((uint)bVar5 * auVar25._4_4_ | (uint)!bVar5 * auVar26._4_4_);
          bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar46._8_4_ = (float)((uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * auVar26._8_4_);
          bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar46._12_4_ = (float)((uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * auVar26._12_4_);
          auVar81._0_4_ = auVar46._0_4_ * auVar46._0_4_;
          auVar81._4_4_ = auVar46._4_4_ * auVar46._4_4_;
          auVar81._8_4_ = auVar46._8_4_ * auVar46._8_4_;
          auVar81._12_4_ = auVar46._12_4_ * auVar46._12_4_;
          auVar102._8_4_ = 0x3d9021bb;
          auVar102._0_8_ = 0x3d9021bb3d9021bb;
          auVar102._12_4_ = 0x3d9021bb;
          auVar29._8_4_ = 0xbdebd1b8;
          auVar29._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar29._12_4_ = 0xbdebd1b8;
          auVar25 = vfmadd213ps_avx512vl(auVar102,auVar46,auVar29);
          auVar30._8_4_ = 0x3def251a;
          auVar30._0_8_ = 0x3def251a3def251a;
          auVar30._12_4_ = 0x3def251a;
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar46,auVar30);
          auVar31._8_4_ = 0xbdfe5d4f;
          auVar31._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar31._12_4_ = 0xbdfe5d4f;
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar46,auVar31);
          auVar32._8_4_ = 0x3e11e9bf;
          auVar32._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar32._12_4_ = 0x3e11e9bf;
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar46,auVar32);
          auVar33._8_4_ = 0xbe2aae50;
          auVar33._0_8_ = 0xbe2aae50be2aae50;
          auVar33._12_4_ = 0xbe2aae50;
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar46,auVar33);
          auVar34._8_4_ = 0x3e4cceac;
          auVar34._0_8_ = 0x3e4cceac3e4cceac;
          auVar34._12_4_ = 0x3e4cceac;
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar46,auVar34);
          auVar35._8_4_ = 0xbe7ffffc;
          auVar35._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar35._12_4_ = 0xbe7ffffc;
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar46,auVar35);
          auVar36._8_4_ = 0x3eaaaaaa;
          auVar36._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar36._12_4_ = 0x3eaaaaaa;
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar46,auVar36);
          auVar103._0_4_ = auVar81._0_4_ * auVar46._0_4_ * auVar25._0_4_;
          auVar103._4_4_ = auVar81._4_4_ * auVar46._4_4_ * auVar25._4_4_;
          auVar103._8_4_ = auVar81._8_4_ * auVar46._8_4_ * auVar25._8_4_;
          auVar103._12_4_ = auVar81._12_4_ * auVar46._12_4_ * auVar25._12_4_;
          auVar45._8_4_ = 0xffffff82;
          auVar45._0_8_ = 0xffffff82ffffff82;
          auVar45._12_4_ = 0xffffff82;
          auVar25 = vpaddd_avx512vl(auVar88,auVar45);
          auVar25 = vcvtdq2ps_avx(auVar25);
          auVar26 = vsubps_avx512vl(auVar25,auVar129);
          bVar5 = (bool)((byte)uVar17 & 1);
          auVar88._0_4_ = (uint)bVar5 * auVar26._0_4_ | (uint)!bVar5 * auVar25._0_4_;
          bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar88._4_4_ = (uint)bVar5 * auVar26._4_4_ | (uint)!bVar5 * auVar25._4_4_;
          bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar88._8_4_ = (uint)bVar5 * auVar26._8_4_ | (uint)!bVar5 * auVar25._8_4_;
          bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar88._12_4_ = (uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * auVar25._12_4_;
          auVar25 = vfmadd231ps_fma(auVar103,auVar88,auVar137);
          auVar25 = vfmsub231ps_fma(auVar25,auVar123,auVar81);
          auVar25 = vsubps_avx(auVar25,auVar46);
          auVar25 = vfnmadd231ps_fma(auVar25,auVar133,auVar88);
          auVar26 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar5 = (bool)((byte)uVar23 & 1);
          auVar47._0_4_ =
               (uint)bVar5 * auVar26._0_4_ | (uint)!bVar5 * (int)(auVar25._0_4_ + auVar25._0_4_);
          bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar47._4_4_ =
               (uint)bVar5 * auVar26._4_4_ | (uint)!bVar5 * (int)(auVar25._4_4_ + auVar25._4_4_);
          bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar47._8_4_ =
               (uint)bVar5 * auVar26._8_4_ | (uint)!bVar5 * (int)(auVar25._8_4_ + auVar25._8_4_);
          bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar47._12_4_ =
               (uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * (int)(auVar25._12_4_ + auVar25._12_4_);
          auVar25 = vminps_avx(auVar47,auVar109);
          auVar26 = vmaxps_avx(auVar25,auVar113);
          auVar27 = vfmadd213ps_fma(auVar117,auVar26,auVar123);
          auVar97._0_4_ = (int)auVar27._0_4_;
          auVar97._4_4_ = (int)auVar27._4_4_;
          auVar97._8_4_ = (int)auVar27._8_4_;
          auVar97._12_4_ = (int)auVar27._12_4_;
          auVar25 = vcvtdq2ps_avx(auVar97);
          uVar23 = vcmpps_avx512vl(auVar27,auVar25,1);
          auVar27 = vsubps_avx512vl(auVar25,auVar129);
          bVar5 = (bool)((byte)uVar23 & 1);
          auVar48._0_4_ = (float)((uint)bVar5 * auVar27._0_4_ | (uint)!bVar5 * auVar25._0_4_);
          bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar48._4_4_ = (float)((uint)bVar5 * auVar27._4_4_ | (uint)!bVar5 * auVar25._4_4_);
          bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar48._8_4_ = (float)((uint)bVar5 * auVar27._8_4_ | (uint)!bVar5 * auVar25._8_4_);
          bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar48._12_4_ = (float)((uint)bVar5 * auVar27._12_4_ | (uint)!bVar5 * auVar25._12_4_);
          auVar25 = vfmsub231ps_fma(auVar26,auVar48,auVar133);
          auVar26 = vfnmsub231ps_fma(auVar25,auVar48,auVar137);
          auVar89._0_4_ = auVar26._0_4_ * auVar26._0_4_;
          auVar89._4_4_ = auVar26._4_4_ * auVar26._4_4_;
          auVar89._8_4_ = auVar26._8_4_ * auVar26._8_4_;
          auVar89._12_4_ = auVar26._12_4_ * auVar26._12_4_;
          auVar25 = vfmadd213ps_fma(auVar148,auVar26,auVar141);
          auVar25 = vfmadd213ps_fma(auVar25,auVar26,auVar152);
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar26,auVar37);
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar26,auVar39);
          auVar25 = vfmadd213ps_fma(auVar25,auVar26,auVar123);
          auVar25 = vfmadd213ps_fma(auVar25,auVar89,auVar26);
          auVar39._0_4_ = auVar25._0_4_ + 1.0;
          auVar39._4_4_ = auVar25._4_4_ + 1.0;
          auVar39._8_4_ = auVar25._8_4_ + 1.0;
          auVar39._12_4_ = auVar25._12_4_ + 1.0;
          auVar90._0_4_ = (int)auVar48._0_4_;
          auVar90._4_4_ = (int)auVar48._4_4_;
          auVar90._8_4_ = (int)auVar48._8_4_;
          auVar90._12_4_ = (int)auVar48._12_4_;
          auVar25 = vpslld_avx(auVar90,0x17);
          auVar25 = vpaddd_avx512vl(auVar25,auVar38);
          auVar26 = vfmadd213ps_fma(auVar25,auVar39,auVar129);
          auVar25 = vrcpps_avx(auVar26);
          auVar98._0_4_ = auVar25._0_4_ + auVar25._0_4_;
          auVar98._4_4_ = auVar25._4_4_ + auVar25._4_4_;
          auVar98._8_4_ = auVar25._8_4_ + auVar25._8_4_;
          auVar98._12_4_ = auVar25._12_4_ + auVar25._12_4_;
          auVar37._8_4_ = 0x40000000;
          auVar37._0_8_ = 0x4000000040000000;
          auVar37._12_4_ = 0x40000000;
          auVar26 = vfmsub213ps_avx512vl(auVar26,auVar98,auVar37);
          auVar25 = vfnmadd213ps_fma(auVar26,auVar25,auVar98);
          auVar24 = vfmsub213ps_fma(auVar25,auVar24,auVar24);
          *(undefined1 (*) [16])*pauVar18 = auVar24;
          pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
          lVar22 = lVar22 + 4;
        }
        lVar15 = sVar4 * sVar3 * uVar14;
        for (; (int)lVar22 < (int)uVar19; lVar22 = lVar22 + 1) {
          __x = *(float *)((long)pvVar2 + lVar22 * 4 + lVar15);
          fVar77 = expf(__x);
          fVar77 = logf(fVar77 + 1.0);
          fVar77 = tanhf(fVar77);
          *(float *)((long)pvVar2 + lVar22 * 4 + lVar15) = fVar77 * __x;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}